

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O0

TVector2<double> __thiscall
TVector2<double>::Rotated<double>(TVector2<double> *this,TAngle<double> *angle)

{
  TAngle<double> *in_RDX;
  double dVar1;
  double dVar2;
  double extraout_XMM0_Qa;
  double b;
  TVector2<double> TVar3;
  double sinval;
  double cosval;
  TAngle<double> *angle_local;
  TVector2<double> *this_local;
  
  dVar1 = TAngle<double>::Cos(in_RDX);
  dVar2 = TAngle<double>::Sin(in_RDX);
  b = angle[1].Degrees * dVar1 + angle->Degrees * dVar2;
  TVector2(this,angle->Degrees * dVar1 - angle[1].Degrees * dVar2,b);
  TVar3.Y = b;
  TVar3.X = extraout_XMM0_Qa;
  return TVar3;
}

Assistant:

TVector2 Rotated(TAngle<T> angle)
	{
		double cosval = angle.Cos();
		double sinval = angle.Sin();
		return TVector2(X*cosval - Y*sinval, Y*cosval + X*sinval);
	}